

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::runFullCompilation(Driver *this,bool quiet)

{
  byte bVar1;
  unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> *in_RDI;
  unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> compilation;
  bool in_stack_0000009f;
  Compilation *in_stack_000000a0;
  Driver *in_stack_000000a8;
  Driver *in_stack_000000c8;
  bool in_stack_00000147;
  Driver *in_stack_00000148;
  Compilation *in_stack_00002408;
  Driver *in_stack_00002410;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  createCompilation(in_stack_000000c8);
  std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::operator*
            ((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  reportCompilation(in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
  std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::operator*
            ((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  runAnalysis(in_stack_00002410,in_stack_00002408);
  bVar1 = reportDiagnostics(in_stack_00000148,in_stack_00000147);
  std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
  ~unique_ptr(in_RDI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Driver::runFullCompilation(bool quiet) {
    auto compilation = createCompilation();
    reportCompilation(*compilation, quiet);
    runAnalysis(*compilation);
    return reportDiagnostics(quiet);
}